

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Celero.cpp
# Opt level: O2

shared_ptr<celero::Benchmark> __thiscall
celero::RegisterBaseline
          (celero *this,char *groupName,char *benchmarkName,uint64_t samples,uint64_t iterations,
          uint64_t threads,shared_ptr<celero::Factory> experimentFactory)

{
  Benchmark *this_00;
  element_type *peVar1;
  string *x;
  TestVector *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<celero::Benchmark> sVar2;
  allocator local_a1;
  shared_ptr<celero::Experiment> p;
  string local_90;
  uint64_t local_70;
  char *groupName_local;
  __shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (benchmarkName == (char *)0x0 || groupName == (char *)0x0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    local_70 = threads;
    groupName_local = groupName;
    x = (string *)TestVector::Instance();
    std::__cxx11::string::string((string *)&local_90,groupName,(allocator *)&p);
    TestVector::operator[]((TestVector *)this,x);
    std::__cxx11::string::~string((string *)&local_90);
    if (*(long *)this == 0) {
      std::make_shared<celero::Benchmark,char_const*&>((char **)&local_90);
      std::__shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2> *)&local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_string_length);
      this_01 = TestVector::Instance();
      std::__shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,(__shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2> *)this);
      TestVector::push_back(this_01,(shared_ptr<celero::Benchmark> *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
    std::make_shared<celero::Experiment,std::shared_ptr<celero::Benchmark>&>
              ((shared_ptr<celero::Benchmark> *)&p);
    Experiment::setIsBaselineCase
              (p.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true);
    peVar1 = p.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string((string *)&local_90,benchmarkName,&local_a1);
    Experiment::setName(peVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    Experiment::setSamples
              (p.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr,samples);
    Experiment::setIterations
              (p.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               iterations);
    Experiment::setThreads
              (p.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr,local_70)
    ;
    peVar1 = p.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               (__shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2> *)
               experimentFactory.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    Experiment::setFactory(peVar1,(shared_ptr<celero::Factory> *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    Experiment::setBaselineTarget
              (p.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1.0);
    this_00 = *(Benchmark **)this;
    std::__shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,&p.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>);
    Benchmark::setBaseline(this_00,(shared_ptr<celero::Experiment> *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    benchmarkName = (char *)extraout_RDX;
  }
  sVar2.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)benchmarkName;
  sVar2.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<celero::Benchmark>)
         sVar2.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<celero::Benchmark> celero::RegisterBaseline(const char* groupName, const char* benchmarkName, const uint64_t samples,
															const uint64_t iterations, const uint64_t threads,
															std::shared_ptr<celero::Factory> experimentFactory)
{
	if(groupName != nullptr && benchmarkName != nullptr)
	{
		auto bm = celero::TestVector::Instance()[groupName];

		if(bm == nullptr)
		{
			bm = std::make_shared<Benchmark>(groupName);
			celero::TestVector::Instance().push_back(bm);
		}

		auto p = std::make_shared<Experiment>(bm);
		p->setIsBaselineCase(true);
		p->setName(benchmarkName);
		p->setSamples(samples);
		p->setIterations(iterations);
		p->setThreads(threads);
		p->setFactory(experimentFactory);
		p->setBaselineTarget(1.0);

		bm->setBaseline(p);

		return bm;
	}

	return nullptr;
}